

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O3

bool __thiscall
iDynTree::SimpleLeggedOdometry::changeFixedFrame(SimpleLeggedOdometry *this,string *newFixedFrame)

{
  bool bVar1;
  long newFixedFrame_00;
  
  newFixedFrame_00 = iDynTree::Model::getFrameIndex((string *)this);
  if (newFixedFrame_00 == FRAME_INVALID_INDEX) {
    iDynTree::reportError
              ("SimpleLeggedOdometry","changeFixedFrame",
               "changeFixedFrame was called, but the provided new fixed frame is unknown.");
    return false;
  }
  bVar1 = changeFixedFrame(this,newFixedFrame_00);
  return bVar1;
}

Assistant:

bool SimpleLeggedOdometry::changeFixedFrame(const std::string& newFixedFrame)
{
    iDynTree::FrameIndex newFixedFrameIndex = this->m_model.getFrameIndex(newFixedFrame);

    if( newFixedFrameIndex == FRAME_INVALID_INDEX )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the provided new fixed frame is unknown.");
        return false;
    }

    return this->changeFixedFrame(newFixedFrameIndex);
}